

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csvmodelserialiser.cpp
# Opt level: O2

QString * __thiscall
CsvModelSerialiserPrivate::unescapedCSV
          (QString *__return_storage_ptr__,CsvModelSerialiserPrivate *this,QString *exc)

{
  long lVar1;
  char16_t *pcVar2;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_48;
  QArrayDataPointer<char16_t> local_30;
  
  lVar1 = (exc->d).size;
  if (((lVar1 != 0) && (pcVar2 = (exc->d).ptr, *pcVar2 == L'\"')) && (pcVar2[lVar1 + -1] == L'\"'))
  {
    QString::chop((longlong)exc);
    QString::remove((longlong)exc,0);
    local_30.d = (Data *)0x0;
    local_30.ptr = L"\"\"";
    local_30.size = 2;
    local_68.size = 0;
    local_48.d = (Data *)0x0;
    local_68.d = (Data *)0x0;
    local_68.ptr = (char16_t *)0x0;
    local_48.ptr = L"\"";
    local_48.size = 1;
    local_88.d = (Data *)0x0;
    local_88.ptr = (char16_t *)0x0;
    local_88.size = 0;
    QString::replace(exc,(QString *)&local_30,(CaseSensitivity)&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  QString::QString(__return_storage_ptr__,exc);
  return __return_storage_ptr__;
}

Assistant:

QString CsvModelSerialiserPrivate::unescapedCSV(QString exc) const
{
    if (exc.isEmpty())
        return exc;
    if (*exc.constBegin() == QLatin1Char('\"') && *(exc.constEnd() - 1) == QLatin1Char('\"')) {
        exc.chop(1);
        exc.remove(0, 1);
        exc.replace(QStringLiteral("\"\""), QStringLiteral("\""));
    }
    return exc;
}